

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_3cd9::test_minimum(void **param_1)

{
  roaring64_bitmap_t *file;
  unsigned_long in_RDI;
  roaring64_bitmap_t *unaff_retaddr;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000070;
  roaring64_bitmap_t *in_stack_00000078;
  int in_stack_ffffffffffffffec;
  
  file = roaring64_bitmap_create();
  roaring64_bitmap_minimum(in_stack_00000078);
  _assert_int_equal((unsigned_long)unaff_retaddr,in_RDI,(char *)file,in_stack_ffffffffffffffec);
  roaring64_bitmap_add(unaff_retaddr,in_RDI);
  roaring64_bitmap_add(unaff_retaddr,in_RDI);
  roaring64_bitmap_add(unaff_retaddr,in_RDI);
  roaring64_bitmap_minimum(in_stack_00000078);
  _assert_int_equal((unsigned_long)unaff_retaddr,in_RDI,(char *)file,in_stack_ffffffffffffffec);
  roaring64_bitmap_free(in_stack_00000070);
  return;
}

Assistant:

DEFINE_TEST(test_minimum) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();

    assert_int_equal(roaring64_bitmap_minimum(r), UINT64_MAX);

    roaring64_bitmap_add(r, (1ULL << 34) + 1);
    roaring64_bitmap_add(r, (1ULL << 35) + 1);
    roaring64_bitmap_add(r, (1ULL << 35) + 2);

    assert_int_equal(roaring64_bitmap_minimum(r), ((1ULL << 34) + 1));

    roaring64_bitmap_free(r);
}